

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  ImGuiSizeCallback p_Var1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar6;
  ImVec2 IVar5;
  float fVar7;
  float fVar8;
  float fVar9;
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_30;
  
  IVar5 = *size_desired;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar4 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar9 = IVar5.x;
    fVar6 = IVar5.y;
    if ((fVar7 < 0.0) || (fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar8 < 0.0)) {
      local_30.DesiredSize.x = (window->SizeFull).x;
    }
    else {
      if (fVar9 <= fVar8) {
        fVar8 = fVar9;
      }
      local_30.DesiredSize.x =
           (float)(-(uint)(fVar9 < fVar7) & (uint)fVar7 | ~-(uint)(fVar9 < fVar7) & (uint)fVar8);
    }
    if ((fVar4 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar7 < 0.0)) {
      local_30.DesiredSize.y = (window->SizeFull).y;
    }
    else {
      if (fVar6 <= fVar7) {
        fVar7 = fVar6;
      }
      local_30.DesiredSize.y =
           (float)(-(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar7);
    }
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_30.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_30.Pos = window->Pos;
      local_30.CurrentSize = window->SizeFull;
      (*p_Var1)(&local_30);
    }
    IVar5.x = (float)(int)local_30.DesiredSize.x;
    IVar5.y = (float)(int)local_30.DesiredSize.y;
  }
  uVar2 = window->Flags;
  if ((uVar2 & 0x5000000) == 0x1000000) {
    fVar4 = 4.0;
    fVar7 = 4.0;
    if ((window->ChildFlags & 4U) != 0) {
      fVar7 = (GImGui->Style).WindowMinSize.x;
    }
    if ((window->ChildFlags & 8U) == 0) goto LAB_0018a821;
  }
  else {
    fVar4 = 4.0;
    fVar7 = 4.0;
    if ((uVar2 & 0x40) == 0) {
      fVar7 = (GImGui->Style).WindowMinSize.x;
    }
    if ((uVar2 & 0x40) != 0) goto LAB_0018a821;
  }
  fVar4 = (GImGui->Style).WindowMinSize.y;
LAB_0018a821:
  fVar9 = (GImGui->Style).WindowRounding + -1.0;
  fVar9 = (float)(~-(uint)(fVar9 <= 0.0) & (uint)fVar9) +
          window->TitleBarHeight + window->MenuBarHeight;
  uVar2 = -(uint)(fVar9 <= fVar4);
  fVar4 = (float)(uVar2 & (uint)fVar4 | ~uVar2 & (uint)fVar9);
  uVar2 = -(uint)(fVar7 <= IVar5.x);
  uVar3 = -(uint)(fVar4 <= IVar5.y);
  return (ImVec2)(CONCAT44(~uVar3 & (uint)fVar4,~uVar2 & (uint)fVar7) |
                 CONCAT44((uint)IVar5.y & uVar3,(uint)IVar5.x & uVar2));
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // See comments in SetNextWindowSizeConstraints() for details about setting size_min an size_max.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_TRUNC(new_size.x);
        new_size.y = IM_TRUNC(new_size.y);
    }

    // Minimum size
    ImVec2 size_min = CalcWindowMinSize(window);
    return ImMax(new_size, size_min);
}